

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O2

int64_t client_skip_proxy(archive_read_filter *self,int64_t request)

{
  archive_read *paVar1;
  archive_seek_callback *paVar2;
  bool bVar3;
  la_int64_t lVar4;
  long lVar5;
  
  if (request < 0) {
    __archive_errx(1,"Negative skip requested.");
  }
  if (request != 0) {
    paVar1 = self->archive;
    if ((paVar1->client).skipper != (archive_skip_callback *)0x0) {
      lVar5 = 0;
      do {
        lVar4 = 0x40000000;
        if (request < 0x40000000) {
          lVar4 = request;
        }
        lVar4 = (*(self->archive->client).skipper)(&self->archive->archive,self->data,lVar4);
        lVar5 = lVar5 + lVar4;
        if (lVar4 == 0) {
          return lVar5;
        }
        if (request - lVar4 == 0) {
          return lVar5;
        }
        bVar3 = lVar4 <= request;
        request = request - lVar4;
      } while (bVar3);
      return -0x1e;
    }
    paVar2 = (paVar1->client).seeker;
    if (0x10000 < (ulong)request && paVar2 != (archive_seek_callback *)0x0) {
      lVar5 = self->position;
      lVar4 = (*paVar2)(&paVar1->archive,self->data,request,1);
      if (lVar4 != request + lVar5) {
        return -0x1e;
      }
      return lVar4 - lVar5;
    }
  }
  return 0;
}

Assistant:

static int64_t
client_skip_proxy(struct archive_read_filter *self, int64_t request)
{
	if (request < 0)
		__archive_errx(1, "Negative skip requested.");
	if (request == 0)
		return 0;

	if (self->archive->client.skipper != NULL) {
		/* Seek requests over 1GiB are broken down into
		 * multiple seeks.  This avoids overflows when the
		 * requests get passed through 32-bit arguments. */
		int64_t skip_limit = (int64_t)1 << 30;
		int64_t total = 0;
		for (;;) {
			int64_t get, ask = request;
			if (ask > skip_limit)
				ask = skip_limit;
			get = (self->archive->client.skipper)
				(&self->archive->archive, self->data, ask);
			total += get;
			if (get == 0 || get == request)
				return (total);
			if (get > request)
				return ARCHIVE_FATAL;
			request -= get;
		}
	} else if (self->archive->client.seeker != NULL
		&& request > 64 * 1024) {
		/* If the client provided a seeker but not a skipper,
		 * we can use the seeker to skip forward.
		 *
		 * Note: This isn't always a good idea.  The client
		 * skipper is allowed to skip by less than requested
		 * if it needs to maintain block alignment.  The
		 * seeker is not allowed to play such games, so using
		 * the seeker here may be a performance loss compared
		 * to just reading and discarding.  That's why we
		 * only do this for skips of over 64k.
		 */
		int64_t before = self->position;
		int64_t after = (self->archive->client.seeker)
		    (&self->archive->archive, self->data, request, SEEK_CUR);
		if (after != before + request)
			return ARCHIVE_FATAL;
		return after - before;
	}
	return 0;
}